

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  TokenList *args_3;
  ConditionalBranchDirectiveSyntax *pCVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),&local_31,(BumpAllocator *)__child_stack);
  args_3 = deepClone((TokenList *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::syntax::TokenList&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_30,
                      (ConditionalDirectiveExpressionSyntax *)args_2,args_3);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalBranchDirectiveSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalBranchDirectiveSyntax>(
        node.kind,
        node.directive.deepClone(alloc),
        *deepClone<ConditionalDirectiveExpressionSyntax>(*node.expr, alloc),
        *deepClone(node.disabledTokens, alloc)
    );
}